

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O3

void uo_tcp_conn_advance(uo_cb *cb)

{
  byte bVar1;
  void *pvVar2;
  long lVar3;
  code *cb_func;
  bool bVar4;
  
  pvVar2 = uo_cb_stack_index(cb,0);
  LOCK();
  bVar1 = *(byte *)((long)pvVar2 + 100);
  *(byte *)((long)pvVar2 + 100) = 0;
  UNLOCK();
  if (bVar1 < 0x72) {
    if (bVar1 != 0) {
      if (bVar1 != 99) goto LAB_00105d91;
      cb_func = uo_tcp_conn_close;
      lVar3 = 0x28;
      goto LAB_00105d76;
    }
    LOCK();
    bVar4 = *(char *)((long)pvVar2 + 100) == '\0';
    if (bVar4) {
      *(char *)((long)pvVar2 + 100) = 'i';
    }
    UNLOCK();
    if (bVar4) goto LAB_00105d91;
    cb_func = uo_tcp_conn_advance;
  }
  else {
    if (bVar1 == 0x72) {
      cb_func = uo_tcp_conn_before_recv;
      lVar3 = 8;
    }
    else {
      if (bVar1 != 0x73) goto LAB_00105d91;
      cb_func = uo_tcp_conn_send;
      lVar3 = 0x18;
    }
LAB_00105d76:
    uo_cb_append_cb(cb,*(uo_cb **)(*(long *)((long)pvVar2 + 0x38) + lVar3));
  }
  uo_cb_append_func(cb,cb_func);
LAB_00105d91:
  uo_cb_invoke(cb);
  return;
}

Assistant:

static void uo_tcp_conn_advance(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    switch (atomic_exchange(&tcp_conn->state, '\0'))
    {
        case 'r':
            uo_cb_append(cb, tcp_conn->evt_handlers->before_recv);
            uo_cb_append(cb, uo_tcp_conn_before_recv);
            break;

        case 's':
            uo_cb_append(cb, tcp_conn->evt_handlers->before_send);
            uo_cb_append(cb, uo_tcp_conn_send);
            break;

        case 'c':
            uo_cb_append(cb, tcp_conn->evt_handlers->before_close);
            uo_cb_append(cb, uo_tcp_conn_close);
            break;

        case '\0':
        {
            char current_state = '\0';
            if (!atomic_compare_exchange_strong(&tcp_conn->state, &current_state, 'i'))
                uo_cb_append(cb, uo_tcp_conn_advance);
        }
    }

    uo_cb_invoke(cb);
}